

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_int_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,uniform_int_dist *g)

{
  long lVar1;
  result_type_conflict4 *prVar2;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  uniform_int_dist *in_RSI;
  param_type *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> *unaff_retaddr;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)((long)&in_RDI->a_ + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  prVar2 = &in_RDI->a_;
  _Var3 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)((long)prVar2 + lVar1),_Var3);
  std::operator<<((ostream *)in_RDI,"[uniform_int ");
  uniform_int_dist::param(in_RSI);
  pbVar4 = operator<<(unaff_retaddr,in_RDI);
  std::operator<<((ostream *)pbVar4,']');
  Catch::clara::std::ios_base::flags
            ((ios_base *)((long)&in_RDI->a_ + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                   const uniform_int_dist &g) {
    std::ios_base::fmtflags flags(out.flags());
    out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    out << "[uniform_int " << g.param() << ']';
    out.flags(flags);
    return out;
  }